

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getFirstLeakForAllocationStage
          (MemoryLeakDetectorTable *this,uchar allocation_stage)

{
  long lVar1;
  MemoryLeakDetectorNode *cur;
  MemoryLeakDetectorNode *pMVar2;
  
  lVar1 = 0;
  while( true ) {
    for (pMVar2 = this->table_[lVar1].head_;
        (pMVar2 != (MemoryLeakDetectorNode *)0x0 &&
        (pMVar2[0x34] != (MemoryLeakDetectorNode)allocation_stage));
        pMVar2 = *(MemoryLeakDetectorNode **)(pMVar2 + 0x38)) {
    }
    if (pMVar2 != (MemoryLeakDetectorNode *)0x0) break;
    lVar1 = lVar1 + 1;
    if (lVar1 == 0x49) {
      return (MemoryLeakDetectorNode *)0x0;
    }
  }
  return pMVar2;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getFirstLeakForAllocationStage(unsigned char allocation_stage)
{
    for (int i = 0; i < hash_prime; i++) {
        MemoryLeakDetectorNode* node = table_[i].getFirstLeakForAllocationStage(allocation_stage);
        if (node) return node;
    }
    return NULLPTR;
}